

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QThread::setEventDispatcher(QThread *this,QAbstractEventDispatcher *eventDispatcher)

{
  QObjectData *pQVar1;
  QThread *pQVar2;
  
  pQVar1 = (this->super_QObject).d_ptr.d;
  if (pQVar1[2].q_ptr[6]._vptr_QObject == (_func_int **)0x0) {
    QObject::moveToThread(&eventDispatcher->super_QObject,this);
    pQVar2 = QObject::thread(&eventDispatcher->super_QObject);
    if (pQVar2 == this) {
      pQVar1[2].q_ptr[6]._vptr_QObject = (_func_int **)eventDispatcher;
    }
    else {
      setEventDispatcher();
    }
  }
  else {
    setEventDispatcher();
  }
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }